

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_seg_normal(REF_NODE ref_node,REF_INT *nodes,REF_DBL *normal)

{
  int iVar1;
  int iVar2;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *xyz1;
  REF_DBL *xyz0;
  REF_DBL *normal_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  if ((((*nodes < 0) || (ref_node->max <= *nodes)) || (ref_node->global[*nodes] < 0)) ||
     (((nodes[1] < 0 || (ref_node->max <= nodes[1])) || (ref_node->global[nodes[1]] < 0)))) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8c2,
           "ref_node_seg_normal",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    pRVar3 = ref_node->real;
    iVar1 = *nodes;
    pRVar4 = ref_node->real;
    iVar2 = nodes[1];
    *normal = (pRVar4 + iVar2 * 0xf)[1] - (pRVar3 + iVar1 * 0xf)[1];
    normal[1] = pRVar3[iVar1 * 0xf] - pRVar4[iVar2 * 0xf];
    normal[2] = 0.0;
    ref_node_local._4_4_ = ref_math_normalize(normal);
    if (ref_node_local._4_4_ == 0) {
      ref_node_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8cb,
             "ref_node_seg_normal",(ulong)ref_node_local._4_4_,"normalize");
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_seg_normal(REF_NODE ref_node, REF_INT *nodes,
                                       REF_DBL *normal) {
  REF_DBL *xyz0, *xyz1;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]))
    RSS(REF_INVALID, "node invalid");

  xyz0 = ref_node_xyz_ptr(ref_node, nodes[0]);
  xyz1 = ref_node_xyz_ptr(ref_node, nodes[1]);

  normal[0] = xyz1[1] - xyz0[1];
  normal[1] = xyz0[0] - xyz1[0];
  normal[2] = 0.0;

  RSS(ref_math_normalize(normal), "normalize");

  return REF_SUCCESS;
}